

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

void __thiscall
flatbuffers::ResizeContext::Straddle<unsigned_int,1>
          (ResizeContext *this,void *first,void *second,void *offsetloc)

{
  if (this->startptr_ <= second && first <= this->startptr_) {
    *(int *)offsetloc = *offsetloc + this->delta_;
    (this->dag_check_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start
    [(long)offsetloc -
     (long)(this->buf_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start >> 2] = '\x01';
  }
  return;
}

Assistant:

void Straddle(const void *first, const void *second, void *offsetloc) {
    if (first <= startptr_ && second >= startptr_) {
      WriteScalar<T>(offsetloc, ReadScalar<T>(offsetloc) + delta_ * D);
      DagCheck(offsetloc) = true;
    }
  }